

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_p_race_stats(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  player_race *r;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"str");
    *(wchar_t *)((long)pvVar2 + 0x3c) = wVar1;
    wVar1 = parser_getint(p,"dex");
    *(wchar_t *)((long)pvVar2 + 0x48) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar2 + 0x4c) = wVar1;
    wVar1 = parser_getint(p,"int");
    *(wchar_t *)((long)pvVar2 + 0x40) = wVar1;
    wVar1 = parser_getint(p,"wis");
    *(wchar_t *)((long)pvVar2 + 0x44) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_p_race_stats(struct parser *p) {
	struct player_race *r = parser_priv(p);
	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	r->r_adj[STAT_STR] = parser_getint(p, "str");
	r->r_adj[STAT_DEX] = parser_getint(p, "dex");
	r->r_adj[STAT_CON] = parser_getint(p, "con");
	r->r_adj[STAT_INT] = parser_getint(p, "int");
	r->r_adj[STAT_WIS] = parser_getint(p, "wis");
	return PARSE_ERROR_NONE;
}